

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O1

int pkcs12_pbe_derive_key_iv
              (mbedtls_asn1_buf *pbe_params,mbedtls_md_type_t md_type,uchar *pwd,size_t pwdlen,
              uchar *key,size_t keylen,uchar *iv,size_t ivlen)

{
  uchar **p;
  int iVar1;
  size_t sVar2;
  uchar *end;
  ulong uVar3;
  int iterations;
  size_t local_168;
  ulong local_160;
  mbedtls_asn1_buf salt;
  uchar unipwd [258];
  
  iterations = 0;
  if (0x80 < pwdlen) {
    return -0x1f80;
  }
  salt.tag = 0;
  salt._4_4_ = 0;
  salt.len = 0;
  salt.p = (uchar *)0x0;
  memset(unipwd,0,0x102);
  iVar1 = -0x1ee2;
  uVar3 = (ulong)md_type;
  if (pbe_params->tag == 0x30) {
    p = &pbe_params->p;
    end = pbe_params->p + pbe_params->len;
    local_168 = keylen;
    local_160 = (ulong)md_type;
    iVar1 = mbedtls_asn1_get_tag(p,end,&salt.len,4);
    if (iVar1 == 0) {
      salt.p = *p;
      *p = salt.p + salt.len;
      iVar1 = mbedtls_asn1_get_int(p,end,&iterations);
      if (iVar1 == 0) {
        iVar1 = -0x1ee6;
        uVar3 = local_160;
        keylen = local_168;
        if (*p == end) {
          iVar1 = 0;
        }
        goto LAB_0014c8b8;
      }
    }
    iVar1 = iVar1 + -0x1e80;
    uVar3 = local_160;
    keylen = local_168;
  }
LAB_0014c8b8:
  if (iVar1 == 0) {
    if (pwdlen != 0) {
      sVar2 = 0;
      do {
        unipwd[sVar2 * 2 + 1] = pwd[sVar2];
        sVar2 = sVar2 + 1;
      } while (pwdlen != sVar2);
    }
    sVar2 = pwdlen * 2 + 2;
    iVar1 = mbedtls_pkcs12_derivation
                      (key,keylen,unipwd,sVar2,salt.p,salt.len,(mbedtls_md_type_t)uVar3,1,iterations
                      );
    if ((iVar1 == 0) && (iVar1 = 0, ivlen != 0 && iv != (uchar *)0x0)) {
      iVar1 = mbedtls_pkcs12_derivation
                        (iv,ivlen,unipwd,sVar2,salt.p,salt.len,(mbedtls_md_type_t)uVar3,2,iterations
                        );
    }
  }
  return iVar1;
}

Assistant:

static int pkcs12_pbe_derive_key_iv( mbedtls_asn1_buf *pbe_params, mbedtls_md_type_t md_type,
                                     const unsigned char *pwd,  size_t pwdlen,
                                     unsigned char *key, size_t keylen,
                                     unsigned char *iv,  size_t ivlen )
{
    int ret, iterations = 0;
    mbedtls_asn1_buf salt;
    size_t i;
    unsigned char unipwd[PKCS12_MAX_PWDLEN * 2 + 2];

    if( pwdlen > PKCS12_MAX_PWDLEN )
        return( MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA );

    memset( &salt, 0, sizeof(mbedtls_asn1_buf) );
    memset( &unipwd, 0, sizeof(unipwd) );

    if( ( ret = pkcs12_parse_pbe_params( pbe_params, &salt,
                                         &iterations ) ) != 0 )
        return( ret );

    for( i = 0; i < pwdlen; i++ )
        unipwd[i * 2 + 1] = pwd[i];

    if( ( ret = mbedtls_pkcs12_derivation( key, keylen, unipwd, pwdlen * 2 + 2,
                                   salt.p, salt.len, md_type,
                                   MBEDTLS_PKCS12_DERIVE_KEY, iterations ) ) != 0 )
    {
        return( ret );
    }

    if( iv == NULL || ivlen == 0 )
        return( 0 );

    if( ( ret = mbedtls_pkcs12_derivation( iv, ivlen, unipwd, pwdlen * 2 + 2,
                                   salt.p, salt.len, md_type,
                                   MBEDTLS_PKCS12_DERIVE_IV, iterations ) ) != 0 )
    {
        return( ret );
    }
    return( 0 );
}